

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O2

double __thiscall
TransitionObservationIndependentMADPDiscrete::GetTransitionProbability
          (TransitionObservationIndependentMADPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sucSIs)

{
  MultiAgentDecisionProcessDiscrete *pMVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 1.0;
  uVar2 = 0;
  do {
    uVar4 = (ulong)uVar2;
    uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar3 <= uVar4) {
      return dVar5;
    }
    pMVar1 = (this->_m_individualMADPDs).
             super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4];
    dVar6 = (double)(**(code **)(*(long *)&pMVar1->super_MultiAgentDecisionProcess + 0x110))
                              (pMVar1,(sIs->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar4],
                               (aIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar4],
                               (sucSIs->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar4]);
    uVar2 = uVar2 + 1;
    dVar5 = dVar5 * dVar6;
  } while ((dVar5 != 0.0) || (NAN(dVar5)));
  return dVar5;
}

Assistant:

double GetTransitionProbability(const std::vector<Index> &sIs,
                                    const std::vector<Index> &aIs,
                                    const std::vector<Index> &sucSIs) const
        { 
            double p=1;
            for(Index agI = 0; agI < GetNrAgents(); agI++)
            {
                p*=GetIndividualMADPD(agI)->GetTransitionProbability(
                    sIs[agI],
                    aIs[agI],
                    sucSIs[agI]);
                if(p==0)
                    break;
            }
            return(p);
        }